

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmTargetTraceDependencies::cmTargetTraceDependencies
          (cmTargetTraceDependencies *this,cmGeneratorTarget *target)

{
  iterator *piVar1;
  _Rb_tree_header *p_Var2;
  cmLocalGenerator *pcVar3;
  _Elt_pointer ppcVar4;
  pointer pcVar5;
  bool bVar6;
  cmMakefile *this_00;
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *__x;
  string *psVar7;
  ostream *poVar8;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar9;
  cmCustomCommand *command;
  pointer pcVar10;
  pointer ppcVar11;
  pair<std::_Rb_tree_iterator<cmSourceFile_*>,_bool> pVar12;
  cmSourceFile *sf;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_> emitted;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  tgts;
  ostringstream e;
  cmSourceFile *local_290;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_288;
  deque<cmSourceFile*,std::allocator<cmSourceFile*>> *local_268;
  _Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
  *local_260;
  string *local_258;
  string *local_250;
  pointer local_248;
  string local_240;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_220;
  _Rb_tree<cmSourceFile_*,_cmSourceFile_*,_std::_Identity<cmSourceFile_*>,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
  local_208;
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  local_1d8;
  undefined1 local_1a8 [376];
  
  this->GeneratorTarget = target;
  local_268 = (deque<cmSourceFile*,std::allocator<cmSourceFile*>> *)&this->SourceQueue;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::_M_initialize_map
            ((_Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_268,0);
  local_260 = (_Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
               *)&this->SourcesQueued;
  p_Var2 = &(this->SourcesQueued)._M_t._M_impl.super__Rb_tree_header;
  (this->SourcesQueued)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SourcesQueued)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->SourcesQueued)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->SourcesQueued)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->SourcesQueued)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->NameMap)._M_t._M_impl.super__Rb_tree_header;
  (this->NameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->NameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->NameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->NameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->NameMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->NewSources).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->NewSources).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->NewSources).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = cmTarget::GetMakefile(target->Target);
  this->Makefile = this_00;
  pcVar3 = target->LocalGenerator;
  this->LocalGenerator = pcVar3;
  this->GlobalGenerator = pcVar3->GlobalGenerator;
  this->CurrentEntry = (SourceEntry *)0x0;
  local_208._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_208._M_impl.super__Rb_tree_header._M_header;
  local_208._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_208._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_208._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_208._M_impl.super__Rb_tree_header._M_header._M_right =
       local_208._M_impl.super__Rb_tree_header._M_header._M_left;
  cmMakefile::GetGeneratorConfigs_abi_cxx11_(&local_220,this_00,IncludeEmptyConfig);
  local_258 = local_220.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_220.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_220.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_288.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_288.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_288.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_250 = local_220.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      cmGeneratorTarget::GetSourceFiles
                (this->GeneratorTarget,&local_288,
                 local_220.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      local_248 = local_288.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      ppcVar11 = local_288.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (local_288.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_288.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          local_290 = *ppcVar11;
          __x = &cmGlobalGenerator::GetFilenameTargetDepends(this->GlobalGenerator,local_290)->_M_t;
          std::
          _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          ::_Rb_tree(&local_1d8,__x);
          bVar6 = ::cm::
                  contains<std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_cmGeneratorTarget_*,_0>
                            ((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                              *)&local_1d8,&this->GeneratorTarget);
          if (bVar6) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Evaluation output file\n  \"",0x1a);
            psVar7 = cmSourceFile::ResolveFullPath(local_290,(string *)0x0,(string *)0x0);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,(psVar7->_M_dataplus)._M_p,
                                psVar7->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,
                       "\"\ndepends on the sources of a target it is used in.  This is a dependency loop and is not allowed."
                       ,0x62);
            pcVar3 = this->GeneratorTarget->LocalGenerator;
            std::__cxx11::stringbuf::str();
            cmLocalGenerator::IssueMessage(pcVar3,FATAL_ERROR,&local_240);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_240._M_dataplus._M_p != &local_240.field_2) {
              operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          }
          else {
            pVar12 = std::
                     _Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
                     ::_M_insert_unique<cmSourceFile*const&>
                               ((_Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
                                 *)&local_208,&local_290);
            if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              pVar12 = std::
                       _Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
                       ::_M_insert_unique<cmSourceFile*const&>(local_260,&local_290);
              if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                ppcVar4 = (this->SourceQueue).c.
                          super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                          .super__Deque_impl_data._M_finish._M_cur;
                if (ppcVar4 ==
                    (this->SourceQueue).c.
                    super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_last + -1) {
                  std::deque<cmSourceFile*,std::allocator<cmSourceFile*>>::
                  _M_push_back_aux<cmSourceFile*const&>(local_268,&local_290);
                }
                else {
                  *ppcVar4 = local_290;
                  piVar1 = &(this->SourceQueue).c.
                            super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Deque_impl_data._M_finish;
                  piVar1->_M_cur = piVar1->_M_cur + 1;
                }
              }
            }
          }
          std::
          _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          ::~_Rb_tree(&local_1d8);
          if (bVar6) {
            if (local_288.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_288.
                              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_288.
                                    super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_288.
                                    super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            goto LAB_0043b046;
          }
          ppcVar11 = ppcVar11 + 1;
        } while (ppcVar11 != local_248);
      }
      if (local_288.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_288.
                        super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_288.
                              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_288.
                              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      local_220.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_250 + 1;
    } while (local_220.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start != local_258);
  }
  pvVar9 = cmTarget::GetPreBuildCommands(this->GeneratorTarget->Target);
  pcVar5 = (pvVar9->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pcVar10 = (pvVar9->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
                 _M_impl.super__Vector_impl_data._M_start; pcVar10 != pcVar5; pcVar10 = pcVar10 + 1)
  {
    CheckCustomCommand(this,pcVar10);
  }
  pvVar9 = cmTarget::GetPreLinkCommands(this->GeneratorTarget->Target);
  pcVar5 = (pvVar9->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pcVar10 = (pvVar9->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
                 _M_impl.super__Vector_impl_data._M_start; pcVar10 != pcVar5; pcVar10 = pcVar10 + 1)
  {
    CheckCustomCommand(this,pcVar10);
  }
  pvVar9 = cmTarget::GetPostBuildCommands(this->GeneratorTarget->Target);
  pcVar5 = (pvVar9->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pcVar10 = (pvVar9->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
                 _M_impl.super__Vector_impl_data._M_start; pcVar10 != pcVar5; pcVar10 = pcVar10 + 1)
  {
    CheckCustomCommand(this,pcVar10);
  }
LAB_0043b046:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_220);
  std::
  _Rb_tree<cmSourceFile_*,_cmSourceFile_*,_std::_Identity<cmSourceFile_*>,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
  ::~_Rb_tree(&local_208);
  return;
}

Assistant:

cmTargetTraceDependencies::cmTargetTraceDependencies(cmGeneratorTarget* target)
  : GeneratorTarget(target)
{
  // Convenience.
  this->Makefile = target->Target->GetMakefile();
  this->LocalGenerator = target->GetLocalGenerator();
  this->GlobalGenerator = this->LocalGenerator->GetGlobalGenerator();
  this->CurrentEntry = nullptr;

  // Queue all the source files already specified for the target.
  std::set<cmSourceFile*> emitted;
  std::vector<std::string> const& configs =
    this->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);
  for (std::string const& c : configs) {
    std::vector<cmSourceFile*> sources;
    this->GeneratorTarget->GetSourceFiles(sources, c);
    for (cmSourceFile* sf : sources) {
      const std::set<cmGeneratorTarget const*> tgts =
        this->GlobalGenerator->GetFilenameTargetDepends(sf);
      if (cm::contains(tgts, this->GeneratorTarget)) {
        std::ostringstream e;
        e << "Evaluation output file\n  \"" << sf->ResolveFullPath()
          << "\"\ndepends on the sources of a target it is used in.  This "
             "is a dependency loop and is not allowed.";
        this->GeneratorTarget->LocalGenerator->IssueMessage(
          MessageType::FATAL_ERROR, e.str());
        return;
      }
      if (emitted.insert(sf).second && this->SourcesQueued.insert(sf).second) {
        this->SourceQueue.push(sf);
      }
    }
  }

  // Queue pre-build, pre-link, and post-build rule dependencies.
  this->CheckCustomCommands(this->GeneratorTarget->GetPreBuildCommands());
  this->CheckCustomCommands(this->GeneratorTarget->GetPreLinkCommands());
  this->CheckCustomCommands(this->GeneratorTarget->GetPostBuildCommands());
}